

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * Imath_3_2::Matrix44<float>::multiply(Matrix44<float> *a,Matrix44<float> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Matrix44<float> *in_RDI;
  
  fVar4 = a->x[0][0];
  fVar5 = a->x[0][1];
  fVar6 = a->x[0][2];
  fVar7 = a->x[0][3];
  fVar8 = a->x[1][0];
  fVar9 = a->x[1][1];
  fVar10 = a->x[1][2];
  fVar11 = a->x[1][3];
  fVar12 = a->x[2][0];
  fVar13 = a->x[2][1];
  fVar14 = a->x[2][2];
  fVar15 = a->x[2][3];
  fVar16 = a->x[3][0];
  fVar17 = b->x[0][0];
  fVar18 = b->x[0][1];
  fVar19 = b->x[0][2];
  fVar20 = b->x[0][3];
  fVar21 = b->x[1][0];
  fVar22 = b->x[1][1];
  fVar23 = b->x[1][2];
  fVar24 = b->x[1][3];
  fVar25 = b->x[2][0];
  fVar26 = b->x[2][1];
  fVar27 = b->x[2][2];
  fVar28 = b->x[2][3];
  fVar29 = b->x[3][0];
  fVar30 = b->x[3][1];
  fVar31 = b->x[3][2];
  fVar32 = b->x[3][3];
  fVar1 = a->x[3][1];
  fVar2 = a->x[3][2];
  fVar3 = a->x[3][3];
  in_RDI->x[0][0] = fVar7 * fVar29 + fVar6 * fVar25 + fVar4 * fVar17 + fVar5 * fVar21;
  in_RDI->x[0][1] = fVar7 * fVar30 + fVar6 * fVar26 + fVar4 * fVar18 + fVar5 * fVar22;
  in_RDI->x[0][2] = fVar7 * fVar31 + fVar6 * fVar27 + fVar4 * fVar19 + fVar5 * fVar23;
  in_RDI->x[0][3] = fVar7 * fVar32 + fVar6 * fVar28 + fVar4 * fVar20 + fVar5 * fVar24;
  in_RDI->x[1][0] = fVar11 * fVar29 + fVar10 * fVar25 + fVar8 * fVar17 + fVar9 * fVar21;
  in_RDI->x[1][1] = fVar11 * fVar30 + fVar10 * fVar26 + fVar8 * fVar18 + fVar9 * fVar22;
  in_RDI->x[1][2] = fVar11 * fVar31 + fVar10 * fVar27 + fVar8 * fVar19 + fVar9 * fVar23;
  in_RDI->x[1][3] = fVar11 * fVar32 + fVar10 * fVar28 + fVar8 * fVar20 + fVar9 * fVar24;
  in_RDI->x[2][0] = fVar15 * fVar29 + fVar14 * fVar25 + fVar12 * fVar17 + fVar13 * fVar21;
  in_RDI->x[2][1] = fVar15 * fVar30 + fVar14 * fVar26 + fVar12 * fVar18 + fVar13 * fVar22;
  in_RDI->x[2][2] = fVar15 * fVar31 + fVar14 * fVar27 + fVar12 * fVar19 + fVar13 * fVar23;
  in_RDI->x[2][3] = fVar15 * fVar32 + fVar14 * fVar28 + fVar12 * fVar20 + fVar13 * fVar24;
  in_RDI->x[3][0] = fVar3 * fVar29 + fVar2 * fVar25 + fVar16 * fVar17 + fVar1 * fVar21;
  in_RDI->x[3][1] = fVar3 * fVar30 + fVar2 * fVar26 + fVar16 * fVar18 + fVar1 * fVar22;
  in_RDI->x[3][2] = fVar3 * fVar31 + fVar2 * fVar27 + fVar16 * fVar19 + fVar1 * fVar23;
  in_RDI->x[3][3] = fVar3 * fVar32 + fVar2 * fVar28 + fVar16 * fVar20 + fVar1 * fVar24;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE inline IMATH_CONSTEXPR14 Matrix44<T>
Matrix44<T>::multiply (const Matrix44& a, const Matrix44& b) IMATH_NOEXCEPT
{
    const auto a00 = a.x[0][0];
    const auto a01 = a.x[0][1];
    const auto a02 = a.x[0][2];
    const auto a03 = a.x[0][3];

    const auto c00 =
        a00 * b.x[0][0] + a01 * b.x[1][0] + a02 * b.x[2][0] + a03 * b.x[3][0];
    const auto c01 =
        a00 * b.x[0][1] + a01 * b.x[1][1] + a02 * b.x[2][1] + a03 * b.x[3][1];
    const auto c02 =
        a00 * b.x[0][2] + a01 * b.x[1][2] + a02 * b.x[2][2] + a03 * b.x[3][2];
    const auto c03 =
        a00 * b.x[0][3] + a01 * b.x[1][3] + a02 * b.x[2][3] + a03 * b.x[3][3];

    const auto a10 = a.x[1][0];
    const auto a11 = a.x[1][1];
    const auto a12 = a.x[1][2];
    const auto a13 = a.x[1][3];

    const auto c10 =
        a10 * b.x[0][0] + a11 * b.x[1][0] + a12 * b.x[2][0] + a13 * b.x[3][0];
    const auto c11 =
        a10 * b.x[0][1] + a11 * b.x[1][1] + a12 * b.x[2][1] + a13 * b.x[3][1];
    const auto c12 =
        a10 * b.x[0][2] + a11 * b.x[1][2] + a12 * b.x[2][2] + a13 * b.x[3][2];
    const auto c13 =
        a10 * b.x[0][3] + a11 * b.x[1][3] + a12 * b.x[2][3] + a13 * b.x[3][3];

    const auto a20 = a.x[2][0];
    const auto a21 = a.x[2][1];
    const auto a22 = a.x[2][2];
    const auto a23 = a.x[2][3];

    const auto c20 =
        a20 * b.x[0][0] + a21 * b.x[1][0] + a22 * b.x[2][0] + a23 * b.x[3][0];
    const auto c21 =
        a20 * b.x[0][1] + a21 * b.x[1][1] + a22 * b.x[2][1] + a23 * b.x[3][1];
    const auto c22 =
        a20 * b.x[0][2] + a21 * b.x[1][2] + a22 * b.x[2][2] + a23 * b.x[3][2];
    const auto c23 =
        a20 * b.x[0][3] + a21 * b.x[1][3] + a22 * b.x[2][3] + a23 * b.x[3][3];

    const auto a30 = a.x[3][0];
    const auto a31 = a.x[3][1];
    const auto a32 = a.x[3][2];
    const auto a33 = a.x[3][3];

    const auto c30 =
        a30 * b.x[0][0] + a31 * b.x[1][0] + a32 * b.x[2][0] + a33 * b.x[3][0];
    const auto c31 =
        a30 * b.x[0][1] + a31 * b.x[1][1] + a32 * b.x[2][1] + a33 * b.x[3][1];
    const auto c32 =
        a30 * b.x[0][2] + a31 * b.x[1][2] + a32 * b.x[2][2] + a33 * b.x[3][2];
    const auto c33 =
        a30 * b.x[0][3] + a31 * b.x[1][3] + a32 * b.x[2][3] + a33 * b.x[3][3];
    return Matrix44 (
        c00,
        c01,
        c02,
        c03,
        c10,
        c11,
        c12,
        c13,
        c20,
        c21,
        c22,
        c23,
        c30,
        c31,
        c32,
        c33);
}